

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::logError
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *vec4_expected,vec4<float> *vec4_result,
          GLuint array_length,bool *result)

{
  ostringstream *this_00;
  long lVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  GLchar functions [4];
  GLchar functions_inverted [4];
  GLchar functions_dynamic_inverted [4];
  GLchar functions_dynamic [4];
  GLuint dynamic_combination [4];
  vec4<float> dynamic_values [5];
  MessageBuilder message;
  
  dynamic_combination[0] = combination[indices->m_x];
  dynamic_combination[1] = combination[indices->m_y];
  dynamic_combination[2] = combination[indices->m_z];
  dynamic_combination[3] = combination[indices->m_w];
  lVar1 = 3;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    bVar4 = combination[lVar3] == 0 | 0x2a;
    bVar5 = dynamic_combination[lVar3] == 0 | 0x2a;
    functions[lVar3] = bVar4;
    functions_inverted[lVar1] = bVar4;
    functions_dynamic[lVar3] = bVar5;
    functions_dynamic_inverted[lVar1] = bVar5;
    lVar1 = lVar1 + -1;
  }
  this_00 = &message.m_str;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 7) {
      return;
    }
    if (result[uVar2] == false) break;
    if (array_length != 4) {
      message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                      "Error. Invalid array length: ");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,". Expected 4.");
      tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
    uVar2 = uVar2 + 1;
  }
  (*(code *)((long)&DAT_016a8940 + (long)(int)(&DAT_016a8940)[uVar2 & 0xffffffff]))();
  return;
}

Assistant:

void FunctionalTest7_8::logError(const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left,
								 const Utils::vec4<glw::GLfloat>& right, const Utils::vec4<glw::GLuint>& indices,
								 const Utils::vec4<glw::GLfloat> vec4_expected[7],
								 const Utils::vec4<glw::GLfloat> vec4_result[7], glw::GLuint array_length,
								 bool result[7]) const
{
	static const GLuint n_functions  = 4;
	static const GLuint n_operations = 7;

	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Function symbols */
	GLchar functions[4];
	GLchar functions_inverted[4];
	GLchar functions_dynamic[4];
	GLchar functions_dynamic_inverted[4];

	for (GLuint i = 0; i < n_functions; ++i)
	{
		GLchar function			= (0 == combination[i]) ? '+' : '*';
		GLchar dynamic_function = (0 == dynamic_combination[i]) ? '+' : '*';

		functions[i]									= function;
		functions_inverted[n_functions - i - 1]			= function;
		functions_dynamic[i]							= dynamic_function;
		functions_dynamic_inverted[n_functions - i - 1] = dynamic_function;
	}

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Values used by non-"constant" operations */
	Utils::vec4<glw::GLfloat> dynamic_values[5];
	dynamic_values[0] = left;
	dynamic_values[1] = right;
	dynamic_values[2] = right;
	dynamic_values[3] = right;
	dynamic_values[4] = right;

	/* For each operation */
	for (GLuint i = 0; i < n_operations; ++i)
	{
		/* If result is failure */
		if (false == result[i])
		{
			const GLchar*					 description = 0;
			const Utils::vec4<glw::GLfloat>* input		 = 0;
			const GLchar*					 operation   = 0;

			switch (i)
			{
			case 0:
				description = "Call made with predefined array indices";
				input		= dynamic_values;
				operation   = functions;
				break;
			case 1:
				description = "Call made with predefined array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_inverted;
				break;
			case 2:
				description = "Call made with predefined array indices, for constant values";
				input		= constant_values;
				operation   = functions;
				break;
			case 3:
				description = "Call made with predefined array indices in inverted order, for constant values";
				input		= constant_values;
				operation   = functions_inverted;
				break;
			case 4:
				description = "Call made with dynamic array indices";
				input		= dynamic_values;
				operation   = functions_dynamic;
				break;
			case 5:
				description = "Call made with dynamic array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_dynamic_inverted;
				break;
			case 6:
				description = "Call made with loop";
				input		= dynamic_values;
				operation   = functions;
				break;
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
												<< tcu::TestLog::EndMessage;

			m_context.getTestContext().getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Operation: ((((";
			input[0].log(message);
			for (GLuint function = 0; function < n_functions; ++function)
			{
				message << " " << operation[function] << " ";

				input[function + 1].log(message);

				message << ")";
			}

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Result: ";
			vec4_result[i].log(message);

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Expected: ";
			vec4_expected[i].log(message);

			message << tcu::TestLog::EndMessage;
		}

		/* Check array length, it should be 4 */
		if (4 != array_length)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Error. Invalid array length: " << array_length << ". Expected 4."
												<< tcu::TestLog::EndMessage;
		}
	}
}